

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreRenderTarget.h
# Opt level: O0

ITexture * __thiscall
irr::video::
COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
::getTexture(COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
             *this)

{
  u32 uVar1;
  ITexture **ppIVar2;
  array<irr::video::ITexture_*> *in_RDI;
  u32 i;
  uint index;
  uint local_14;
  
  local_14 = 0;
  while( true ) {
    index = local_14;
    uVar1 = core::array<irr::video::ITexture_*>::size((array<irr::video::ITexture_*> *)0x3690e1);
    if (uVar1 <= index) {
      return (ITexture *)0x0;
    }
    ppIVar2 = core::array<irr::video::ITexture_*>::operator[](in_RDI,index);
    if (*ppIVar2 != (ITexture *)0x0) break;
    local_14 = local_14 + 1;
  }
  ppIVar2 = core::array<irr::video::ITexture_*>::operator[](in_RDI,index);
  return *ppIVar2;
}

Assistant:

ITexture *getTexture() const
	{
		for (u32 i = 0; i < Textures.size(); ++i) {
			if (Textures[i])
				return Textures[i];
		}

		return 0;
	}